

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

int CheckFrameBounds(Frame *frame,int exact,int canvas_width,int canvas_height)

{
  int canvas_height_local;
  int canvas_width_local;
  int exact_local;
  Frame *frame_local;
  
  if (exact == 0) {
    if ((frame->x_offset_ < 0) || (frame->y_offset_ < 0)) {
      return 0;
    }
    if (canvas_width < frame->width_ + frame->x_offset_) {
      return 0;
    }
    if (canvas_height < frame->height_ + frame->y_offset_) {
      return 0;
    }
  }
  else {
    if ((frame->x_offset_ != 0) || (frame->y_offset_ != 0)) {
      return 0;
    }
    if ((frame->width_ != canvas_width) || (frame->height_ != canvas_height)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int CheckFrameBounds(const Frame* const frame, int exact,
                            int canvas_width, int canvas_height) {
  if (exact) {
    if (frame->x_offset_ != 0 || frame->y_offset_ != 0) {
      return 0;
    }
    if (frame->width_ != canvas_width || frame->height_ != canvas_height) {
      return 0;
    }
  } else {
    if (frame->x_offset_ < 0 || frame->y_offset_ < 0) return 0;
    if (frame->width_ + frame->x_offset_ > canvas_width) return 0;
    if (frame->height_ + frame->y_offset_ > canvas_height) return 0;
  }
  return 1;
}